

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_mat * rf_mat_frustum(rf_mat *__return_storage_ptr__,double left,double right,double bottom,
                       double top,double near_val,double far_val)

{
  undefined1 auVar1 [16];
  undefined1 auVar3 [16];
  float fVar4;
  uint uVar5;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined4 uVar11;
  float fVar12;
  undefined4 in_XMM9_Db;
  undefined1 auVar2 [16];
  undefined1 auVar9 [16];
  
  uVar11 = (undefined4)((ulong)near_val >> 0x20);
  fVar12 = (float)(right - left);
  uVar5 = (uint)((ulong)(right - left) >> 0x20);
  fVar4 = (float)near_val;
  auVar6._4_4_ = uVar5;
  auVar6._0_4_ = fVar4;
  auVar6._8_4_ = in_XMM1_Dc;
  auVar6._12_4_ = in_XMM1_Dd;
  auVar7._4_12_ = auVar6._4_12_;
  auVar7._0_4_ = fVar4 + fVar4;
  __return_storage_ptr__->m0 = auVar7._0_4_ / fVar12;
  __return_storage_ptr__->m4 = 0.0;
  __return_storage_ptr__->m6 = 0.0;
  __return_storage_ptr__->m8 = ((float)left + (float)right) / fVar12;
  auVar9._0_8_ = auVar7._0_8_;
  auVar9._8_4_ = uVar5;
  auVar9._12_4_ = (int)((ulong)left >> 0x20);
  auVar8._8_8_ = auVar9._8_8_;
  auVar8._4_4_ = (float)bottom + (float)top;
  auVar8._0_4_ = auVar7._0_4_;
  auVar1._4_4_ = (float)(top - bottom);
  auVar1._0_4_ = (float)(top - bottom);
  auVar1._8_4_ = in_XMM9_Db;
  auVar1._12_4_ = in_XMM9_Db;
  auVar10 = divps(auVar8,auVar1);
  fVar12 = fVar4 + (float)far_val;
  auVar3._0_8_ = CONCAT44(uVar5,fVar12) ^ 0x8000000080000000;
  __return_storage_ptr__->m12 = 0.0;
  __return_storage_ptr__->m1 = 0.0;
  __return_storage_ptr__->m5 = (float)(int)auVar10._0_8_;
  __return_storage_ptr__->m9 = (float)(int)((ulong)auVar10._0_8_ >> 0x20);
  __return_storage_ptr__->m13 = 0.0;
  __return_storage_ptr__->m2 = 0.0;
  auVar3._8_4_ = uVar5 ^ 0x80000000;
  auVar3._12_4_ = uVar5;
  auVar2._8_8_ = auVar3._8_8_;
  auVar2._0_8_ = CONCAT44(fVar4 * (float)far_val * -2.0,fVar12) ^ 0x80000000;
  auVar10._4_4_ = (float)(far_val - near_val);
  auVar10._0_4_ = (float)(far_val - near_val);
  auVar10._8_4_ = uVar11;
  auVar10._12_4_ = uVar11;
  auVar10 = divps(auVar2,auVar10);
  __return_storage_ptr__->m10 = (float)(int)auVar10._0_8_;
  __return_storage_ptr__->m14 = (float)(int)((ulong)auVar10._0_8_ >> 0x20);
  __return_storage_ptr__->m3 = 0.0;
  __return_storage_ptr__->m7 = 0.0;
  __return_storage_ptr__->m11 = -1.0;
  __return_storage_ptr__->m15 = 0.0;
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_mat rf_mat_frustum(double left, double right, double bottom, double top, double near_val, double far_val)
{
    rf_mat result = {0};

    float rl = (float) (right - left);
    float tb = (float) (top - bottom);
    float fn = (float) (far_val - near_val);

    result.m0 = ((float) near_val * 2.0f) / rl;
    result.m1 = 0.0f;
    result.m2 = 0.0f;
    result.m3 = 0.0f;

    result.m4 = 0.0f;
    result.m5 = ((float) near_val * 2.0f) / tb;
    result.m6 = 0.0f;
    result.m7 = 0.0f;

    result.m8 = ((float) right + (float) left) / rl;
    result.m9 = ((float) top + (float) bottom) / tb;
    result.m10 = -((float) far_val + (float) near_val) / fn;
    result.m11 = -1.0f;

    result.m12 = 0.0f;
    result.m13 = 0.0f;
    result.m14 = -((float) far_val * (float) near_val * 2.0f) / fn;
    result.m15 = 0.0f;

    return result;
}